

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Minisat::Clause::calcAbstraction(Clause *this)

{
  int iVar1;
  anon_struct_4_5_613047fb_for_header *in_RDI;
  int i;
  uint32_t abstraction;
  int local_10;
  anon_struct_4_5_613047fb_for_header local_c;
  
  local_c = (anon_struct_4_5_613047fb_for_header)0x0;
  local_10 = 0;
  while( true ) {
    iVar1 = size((Clause *)in_RDI);
    if (iVar1 <= local_10) break;
    iVar1 = Minisat::var((Lit)*(int *)(in_RDI + (long)local_10 + 1));
    local_c = (anon_struct_4_5_613047fb_for_header)(1 << ((byte)iVar1 & 0x1f) | (uint)local_c);
    local_10 = local_10 + 1;
  }
  in_RDI[(ulong)((uint)*in_RDI >> 5) + 1] = local_c;
  return;
}

Assistant:

void calcAbstraction() {
        assert(header.has_extra);
        uint32_t abstraction = 0;
        for (int i = 0; i < size(); i++)
            abstraction |= 1 << (var(data[i].lit) & 31);
        data[header.size].abs = abstraction;  }